

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O0

int mbedtls_cipher_setkey
              (mbedtls_cipher_context_t *ctx,uchar *key,int key_bitlen,mbedtls_operation_t operation
              )

{
  mbedtls_operation_t operation_local;
  int key_bitlen_local;
  uchar *key_local;
  mbedtls_cipher_context_t *ctx_local;
  
  if ((ctx == (mbedtls_cipher_context_t *)0x0) || (ctx->cipher_info == (mbedtls_cipher_info_t *)0x0)
     ) {
    ctx_local._4_4_ = -0x6100;
  }
  else if (((ctx->cipher_info->flags & 2U) == 0) && (ctx->cipher_info->key_bitlen != key_bitlen)) {
    ctx_local._4_4_ = -0x6100;
  }
  else {
    ctx->key_bitlen = key_bitlen;
    ctx->operation = operation;
    if (((operation == MBEDTLS_ENCRYPT) || (ctx->cipher_info->mode == MBEDTLS_MODE_CFB)) ||
       (ctx->cipher_info->mode == MBEDTLS_MODE_CTR)) {
      ctx_local._4_4_ =
           (*ctx->cipher_info->base->setkey_enc_func)(ctx->cipher_ctx,key,ctx->key_bitlen);
    }
    else if (operation == MBEDTLS_DECRYPT) {
      ctx_local._4_4_ =
           (*ctx->cipher_info->base->setkey_dec_func)(ctx->cipher_ctx,key,ctx->key_bitlen);
    }
    else {
      ctx_local._4_4_ = -0x6100;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_cipher_setkey( mbedtls_cipher_context_t *ctx, const unsigned char *key,
        int key_bitlen, const mbedtls_operation_t operation )
{
    if( NULL == ctx || NULL == ctx->cipher_info )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    if( ( ctx->cipher_info->flags & MBEDTLS_CIPHER_VARIABLE_KEY_LEN ) == 0 &&
        (int) ctx->cipher_info->key_bitlen != key_bitlen )
    {
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );
    }

    ctx->key_bitlen = key_bitlen;
    ctx->operation = operation;

    /*
     * For CFB and CTR mode always use the encryption key schedule
     */
    if( MBEDTLS_ENCRYPT == operation ||
        MBEDTLS_MODE_CFB == ctx->cipher_info->mode ||
        MBEDTLS_MODE_CTR == ctx->cipher_info->mode )
    {
        return ctx->cipher_info->base->setkey_enc_func( ctx->cipher_ctx, key,
                ctx->key_bitlen );
    }

    if( MBEDTLS_DECRYPT == operation )
        return ctx->cipher_info->base->setkey_dec_func( ctx->cipher_ctx, key,
                ctx->key_bitlen );

    return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );
}